

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdTransform2d>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdTransform2d *transform,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  string *psVar2;
  ostream *poVar3;
  long *plVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  Property *pPVar9;
  int iVar10;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
  *in_stack_fffffffffffffcc8;
  string local_330;
  long *local_310 [2];
  long local_300 [2];
  undefined1 local_2f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d8;
  string *local_2c8;
  _Base_ptr local_2c0;
  string *local_2b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2b0;
  string *local_2a8;
  string *local_2a0;
  string *local_298;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_290;
  string *local_288;
  _Base_ptr local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c8 = err;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a8._0_8_ = local_1a8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_278,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_280 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar8 = true;
  if (p_Var7 != local_280) {
    local_288 = (string *)&transform->in;
    local_290 = &transform->rotation;
    local_298 = (string *)&transform->scale;
    local_2a0 = (string *)&transform->translation;
    local_2a8 = (string *)&transform->result;
    local_2b0 = &(transform->super_ShaderNode).super_UsdShadePrim.props;
    local_2b8 = warn;
    do {
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      prop = (Property *)(p_Var7 + 2);
      local_1a8._0_8_ = local_1a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:in","");
      pPVar9 = (Property *)local_1a8;
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,(string *)prop,(Property *)local_1a8,local_288,
                 in_stack_fffffffffffffcc8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      iVar10 = 0;
      if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
        iVar10 = 3;
LAB_0024ff71:
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (local_2f0._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1242);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          local_310[0] = local_300;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[10],std::__cxx11::string>
                    (&local_330,(fmt *)local_310,(string *)"inputs:in",
                     (char (*) [10])(local_2f0 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                              local_330._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          psVar2 = local_2c8;
          if (local_310[0] != local_300) {
            operator_delete(local_310[0],local_300[0] + 1);
          }
          if (psVar2 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar4 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)local_310,(ulong)(psVar2->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_330.field_2._M_allocated_capacity = *psVar1;
              local_330.field_2._8_8_ = plVar4[3];
              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
            }
            else {
              local_330.field_2._M_allocated_capacity = *psVar1;
              local_330._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_330._M_string_length = plVar4[1];
            *plVar4 = (long)psVar1;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_330);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          iVar10 = 1;
          goto LAB_0024ff71;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._8_8_ != &aStack_2d8) {
        operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
      }
      if (bVar8) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:rotation","");
        pPVar9 = (Property *)local_1a8;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_2f0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_278,&local_1e8,prop,(string *)local_1a8,local_290);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00250276:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_2f0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1244);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_310[0] = local_300;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[16],std::__cxx11::string>
                      (&local_330,(fmt *)local_310,(string *)"inputs:rotation",
                       (char (*) [16])(local_2f0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                local_330._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            psVar2 = local_2c8;
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
            if (psVar2 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar4 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_310,(ulong)(psVar2->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330.field_2._8_8_ = plVar4[3];
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              }
              else {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_330._M_string_length = plVar4[1];
              *plVar4 = (long)psVar1;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar10 = 1;
            goto LAB_00250276;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != &aStack_2d8) {
          operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
        }
        if (!bVar8) goto LAB_00250e77;
        local_208[0] = local_1f8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inputs:scale","");
        pPVar9 = (Property *)local_1a8;
        (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                  ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208,(string *)prop,(Property *)local_1a8,local_298,
                   in_stack_fffffffffffffcc8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
        iVar10 = 0;
        if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0025057b:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_2f0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1246);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_310[0] = local_300;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      (&local_330,(fmt *)local_310,(string *)"inputs:scale",
                       (char (*) [13])(local_2f0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                local_330._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            psVar2 = local_2c8;
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
            if (psVar2 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar4 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_310,(ulong)(psVar2->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330.field_2._8_8_ = plVar4[3];
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              }
              else {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_330._M_string_length = plVar4[1];
              *plVar4 = (long)psVar1;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar10 = 1;
            goto LAB_0025057b;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != &aStack_2d8) {
          operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
        }
        if (!bVar8) goto LAB_00250e77;
        local_228[0] = local_218;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"inputs:translation","");
        pPVar9 = (Property *)local_1a8;
        (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                  ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_228,(string *)prop,(Property *)local_1a8,local_2a0,
                   in_stack_fffffffffffffcc8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
        iVar10 = 0;
        if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00250880:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_2f0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x1248);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_310[0] = local_300;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[19],std::__cxx11::string>
                      (&local_330,(fmt *)local_310,(string *)"inputs:translation",
                       (char (*) [19])(local_2f0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                local_330._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            psVar2 = local_2c8;
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
            if (psVar2 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar4 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_310,(ulong)(psVar2->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330.field_2._8_8_ = plVar4[3];
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              }
              else {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_330._M_string_length = plVar4[1];
              *plVar4 = (long)psVar1;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar10 = 1;
            goto LAB_00250880;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != &aStack_2d8) {
          operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
        }
        if (!bVar8) goto LAB_00250e77;
        local_248[0] = local_238;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"outputs:result","");
        pPVar9 = (Property *)local_1a8;
        (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                  ((ParseResult *)local_2f0,(_anonymous_namespace_ *)&local_278,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248,(string *)prop,(Property *)local_1a8,local_2a8,
                   (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffffcc8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
        iVar10 = 0;
        if ((local_2f0._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00250b85:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (local_2f0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x124a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_310[0] = local_300;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_310,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      (&local_330,(fmt *)local_310,(string *)"outputs:result",
                       (char (*) [15])(local_2f0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar9);
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_330._M_dataplus._M_p,
                                local_330._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            psVar2 = local_2c8;
            if (local_310[0] != local_300) {
              operator_delete(local_310[0],local_300[0] + 1);
            }
            if (psVar2 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar4 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_310,(ulong)(psVar2->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330.field_2._8_8_ = plVar4[3];
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
              }
              else {
                local_330.field_2._M_allocated_capacity = *psVar1;
                local_330._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_330._M_string_length = plVar4[1];
              *plVar4 = (long)psVar1;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar2,(string *)&local_330);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                operator_delete(local_330._M_dataplus._M_p,
                                local_330.field_2._M_allocated_capacity + 1);
              }
              if (local_310[0] != local_300) {
                operator_delete(local_310[0],local_300[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar10 = 1;
            goto LAB_00250b85;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != &aStack_2d8) {
          operator_delete((void *)local_2f0._8_8_,aStack_2d8._M_allocated_capacity + 1);
        }
        if (!bVar8) goto LAB_00250e77;
        local_2c0 = p_Var7 + 1;
        cVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_278,(key_type *)local_2c0);
        if ((_Rb_tree_header *)cVar5._M_node == &local_278._M_impl.super__Rb_tree_header) {
          pmVar6 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](local_2b0,(key_type *)local_2c0);
          ::std::__cxx11::string::_M_assign((string *)pmVar6);
          (pmVar6->_attrib)._varying_authored = (bool)p_Var7[3].field_0x4;
          (pmVar6->_attrib)._variability = p_Var7[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar6->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar6->_attrib)._var,(any *)&p_Var7[4]._M_parent);
          (pmVar6->_attrib)._var._blocked = SUB41(p_Var7[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar6->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var7[5]._M_parent);
          (pmVar6->_attrib)._var._ts._dirty = SUB41(p_Var7[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar6->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent
                    );
          AttrMetas::operator=(&(pmVar6->_attrib)._metas,(AttrMetas *)(p_Var7 + 7));
          *(_Base_ptr *)&pmVar6->_listOpQual = p_Var7[0x17]._M_parent;
          (pmVar6->_rel).type = *(Type *)&p_Var7[0x17]._M_left;
          Path::operator=(&(pmVar6->_rel).targetPath,(Path *)&p_Var7[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar6->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var7[0x1e]._M_parent);
          (pmVar6->_rel).listOpQual = p_Var7[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar6->_rel)._metas,(AttrMetas *)&p_Var7[0x1f]._M_parent);
          (pmVar6->_rel)._varying_authored = *(bool *)&p_Var7[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar6->_prop_value_type_name);
          pmVar6->_has_custom = *(bool *)&p_Var7[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0)
          ;
        }
        cVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_278,(key_type *)local_2c0);
        if ((_Rb_tree_header *)cVar5._M_node == &local_278._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0x124c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f0,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2c0);
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_2f0._0_8_,local_2f0._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
          }
          psVar2 = local_2c8;
          if (local_2b8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar4 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_330,(ulong)(psVar2->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar1) {
              local_2f0._16_8_ = *psVar1;
              aStack_2d8._M_allocated_capacity = plVar4[3];
              local_2f0._0_8_ = local_2f0 + 0x10;
            }
            else {
              local_2f0._16_8_ = *psVar1;
              local_2f0._0_8_ = (size_type *)*plVar4;
            }
            local_2f0._8_8_ = plVar4[1];
            *plVar4 = (long)psVar1;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2f0);
            if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
              operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
      }
      else {
LAB_00250e77:
        if ((iVar10 != 3) && (iVar10 != 0)) {
          bVar8 = false;
          goto LAB_00250f2f;
        }
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    } while (p_Var7 != local_280);
    bVar8 = true;
  }
LAB_00250f2f:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_278,(_Link_type)local_278._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar8;
}

Assistant:

bool ReconstructShader<UsdTransform2d>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdTransform2d *transform,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("prop = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:in", UsdTransform2d,
                   transform->in)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:rotation", UsdTransform2d,
                   transform->rotation)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:scale", UsdTransform2d,
                   transform->scale)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:translation", UsdTransform2d,
                   transform->translation)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdTransform2d, transform->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, transform->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}